

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O1

CRYPTO_BUFFER * CRYPTO_BUFFER_alloc(uint8_t **out_data,size_t len)

{
  CRYPTO_BUFFER *orig_ptr;
  uint8_t *puVar1;
  
  orig_ptr = (CRYPTO_BUFFER *)OPENSSL_zalloc(0x20);
  if (orig_ptr != (CRYPTO_BUFFER *)0x0) {
    puVar1 = (uint8_t *)OPENSSL_malloc(len);
    orig_ptr->data = puVar1;
    if (puVar1 != (uint8_t *)0x0 || len == 0) {
      orig_ptr->len = len;
      orig_ptr->references = 1;
      *out_data = puVar1;
      return orig_ptr;
    }
    OPENSSL_free(orig_ptr);
  }
  return (CRYPTO_BUFFER *)0x0;
}

Assistant:

CRYPTO_BUFFER *CRYPTO_BUFFER_alloc(uint8_t **out_data, size_t len) {
  CRYPTO_BUFFER *const buf =
      reinterpret_cast<CRYPTO_BUFFER *>(OPENSSL_zalloc(sizeof(CRYPTO_BUFFER)));
  if (buf == NULL) {
    return NULL;
  }

  buf->data = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len));
  if (len != 0 && buf->data == NULL) {
    OPENSSL_free(buf);
    return NULL;
  }
  buf->len = len;
  buf->references = 1;

  *out_data = buf->data;
  return buf;
}